

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_match(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int atom)

{
  int iVar1;
  uint uVar2;
  JSRefCountHeader *p;
  ulong uVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  int64_t iVar6;
  JSValue JVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValueUnion local_78 [2];
  JSValueUnion local_68;
  int64_t local_60;
  JSValueUnion local_58;
  int64_t local_50;
  JSValue local_48;
  
  local_60 = this_val.tag;
  local_68 = this_val.u;
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
  }
  else {
    JVar4 = argv->u;
    iVar6 = argv->tag;
    JVar8 = *argv;
    JVar7 = *argv;
    if (((uint)iVar6 & 0xfffffffe) == 2) {
LAB_0016711f:
      JVar7 = JS_ToStringInternal(ctx,this_val,0);
      if ((uint)JVar7.tag != 6) {
        local_78 = (JSValueUnion  [2])JVar7;
        local_58 = JVar4;
        local_50 = iVar6;
        if (atom == 200) {
          JVar8 = JS_NewStringLen(ctx,"g",1);
          iVar6 = JVar8.tag;
          if ((int)JVar8.tag != 6) {
            uVar3 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
            uVar5 = (ulong)JVar8.u._0_4_;
            iVar1 = 2;
            local_48 = JVar8;
            goto LAB_001672a0;
          }
        }
        else {
          iVar6 = 3;
          iVar1 = 1;
          uVar5 = 0;
          uVar3 = 0;
LAB_001672a0:
          JVar8 = JS_CallConstructorInternal
                            (ctx,ctx->regexp_ctor,ctx->regexp_ctor,iVar1,(JSValue *)&local_58,2);
          if (0xfffffff4 < (uint)iVar6) {
            JVar4.ptr = (void *)(uVar3 | uVar5);
            iVar1 = *JVar4.ptr;
            *(int *)JVar4.ptr = iVar1 + -1;
            if (iVar1 < 2) {
              JVar9.tag = iVar6;
              JVar9.u.ptr = JVar4.ptr;
              __JS_FreeValueRT(ctx->rt,JVar9);
            }
          }
          if ((int)JVar8.tag != 6) {
            JVar7 = JS_InvokeFree(ctx,JVar8,atom,1,(JSValue *)local_78);
            if (0xfffffff4 < local_78[1]._0_4_) {
              iVar1 = *local_78[0].ptr;
              *(int *)local_78[0].ptr = iVar1 + -1;
              if (iVar1 < 2) {
                __JS_FreeValueRT(ctx->rt,(JSValue)local_78);
              }
            }
            uVar3 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
            goto LAB_001671eb;
          }
        }
        if ((0xfffffff4 < (uint)JVar7.tag) &&
           (iVar1 = *JVar7.u.ptr, *(int *)JVar7.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar7);
        }
        uVar3 = 0;
        JVar7 = (JSValue)(ZEXT816(6) << 0x40);
        goto LAB_001671eb;
      }
    }
    else {
      JVar9 = JS_GetPropertyInternal(ctx,*argv,atom,*argv,0);
      uVar2 = (uint)JVar9.tag;
      if (uVar2 != 6) {
        if ((atom != 200) || (iVar1 = check_regexp_g_flag(ctx,JVar7), -1 < iVar1)) {
          if ((uVar2 & 0xfffffffe) != 2) {
            JVar7 = JS_CallFree(ctx,JVar9,JVar8,1,(JSValue *)&local_68);
            uVar3 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
            goto LAB_001671eb;
          }
          goto LAB_0016711f;
        }
        if ((0xfffffff4 < uVar2) &&
           (iVar1 = *JVar9.u.ptr, *(int *)JVar9.u.ptr = iVar1 + -1, iVar1 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar9);
        }
      }
    }
  }
  JVar7 = (JSValue)(ZEXT816(6) << 0x40);
  uVar3 = 0;
LAB_001671eb:
  JVar8.u.ptr = (void *)((ulong)JVar7.u.ptr & 0xffffffff | uVar3);
  JVar8.tag = JVar7.tag;
  return JVar8;
}

Assistant:

static JSValue js_string_match(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int atom)
{
    // match(rx), search(rx), matchAll(rx)
    // atom is JS_ATOM_Symbol_match, JS_ATOM_Symbol_search, or JS_ATOM_Symbol_matchAll
    JSValueConst O = this_val, regexp = argv[0], args[2];
    JSValue matcher, S, rx, result, str;
    int args_len;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    if (!JS_IsUndefined(regexp) && !JS_IsNull(regexp)) {
        matcher = JS_GetProperty(ctx, regexp, atom);
        if (JS_IsException(matcher))
            return JS_EXCEPTION;
        if (atom == JS_ATOM_Symbol_matchAll) {
            if (check_regexp_g_flag(ctx, regexp) < 0) {
                JS_FreeValue(ctx, matcher);
                return JS_EXCEPTION;
            }
        }
        if (!JS_IsUndefined(matcher) && !JS_IsNull(matcher)) {
            return JS_CallFree(ctx, matcher, regexp, 1, &O);
        }
    }
    S = JS_ToString(ctx, O);
    if (JS_IsException(S))
        return JS_EXCEPTION;
    args_len = 1;
    args[0] = regexp;
    str = JS_UNDEFINED;
    if (atom == JS_ATOM_Symbol_matchAll) {
        str = JS_NewString(ctx, "g");
        if (JS_IsException(str))
            goto fail;
        args[args_len++] = (JSValueConst)str;
    }
    rx = JS_CallConstructor(ctx, ctx->regexp_ctor, args_len, args);
    JS_FreeValue(ctx, str);
    if (JS_IsException(rx)) {
    fail:
        JS_FreeValue(ctx, S);
        return JS_EXCEPTION;
    }
    result = JS_InvokeFree(ctx, rx, atom, 1, (JSValueConst *)&S);
    JS_FreeValue(ctx, S);
    return result;
}